

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>
::
write_padded<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>::str_writer<wchar_t>>
          (basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>
           *this,align_spec *spec,str_writer<wchar_t> *f)

{
  ulong uVar1;
  iterator iVar2;
  basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>
  *pbVar3;
  back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> bVar4;
  long lVar5;
  ulong uVar6;
  wchar_t *__last;
  wchar_t *__first;
  ulong uVar7;
  ulong uVar8;
  wchar_t __tmp;
  wchar_t local_48;
  wchar_t local_44;
  ulong local_40;
  basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>
  *local_38;
  
  uVar6 = (ulong)spec->width_;
  uVar1 = f->size_;
  uVar8 = uVar1 - uVar6;
  if (uVar1 < uVar6) {
    local_48 = spec->fill_;
    uVar7 = uVar6 - uVar1;
    if (spec->align_ == ALIGN_CENTER) {
      uVar8 = uVar7 >> 1;
      bVar4.container = *(vector<wchar_t,_std::allocator<wchar_t>_> **)this;
      local_44 = local_48;
      local_40 = uVar8;
      local_38 = this;
      if (1 < uVar7) {
        do {
          iVar2._M_current =
               ((bVar4.container)->super__Vector_base<wchar_t,_std::allocator<wchar_t>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              ((bVar4.container)->super__Vector_base<wchar_t,_std::allocator<wchar_t>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<wchar_t,std::allocator<wchar_t>>::_M_realloc_insert<wchar_t_const&>
                      ((vector<wchar_t,std::allocator<wchar_t>> *)bVar4.container,iVar2,&local_48);
          }
          else {
            *iVar2._M_current = local_48;
            ((bVar4.container)->super__Vector_base<wchar_t,_std::allocator<wchar_t>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar2._M_current + 1;
          }
          uVar8 = uVar8 - 1;
        } while (uVar8 != 0);
      }
      pbVar3 = local_38;
      *(vector<wchar_t,_std::allocator<wchar_t>_> **)local_38 = bVar4.container;
      bVar4 = std::__copy_move<false,false,std::random_access_iterator_tag>::
              __copy_m<wchar_t_const*,std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>>
                        (f->s,f->s + f->size_,bVar4);
      *(vector<wchar_t,_std::allocator<wchar_t>_> **)pbVar3 = bVar4.container;
      local_48 = local_44;
      this = local_38;
      if (uVar7 != local_40) {
        lVar5 = (uVar1 + local_40) - uVar6;
        do {
          iVar2._M_current =
               ((bVar4.container)->super__Vector_base<wchar_t,_std::allocator<wchar_t>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              ((bVar4.container)->super__Vector_base<wchar_t,_std::allocator<wchar_t>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<wchar_t,std::allocator<wchar_t>>::_M_realloc_insert<wchar_t_const&>
                      ((vector<wchar_t,std::allocator<wchar_t>> *)bVar4.container,iVar2,&local_48);
          }
          else {
            *iVar2._M_current = local_48;
            ((bVar4.container)->super__Vector_base<wchar_t,_std::allocator<wchar_t>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar2._M_current + 1;
          }
          lVar5 = lVar5 + 1;
          this = local_38;
        } while (lVar5 != 0);
      }
      goto LAB_0018e7ae;
    }
    if (spec->align_ != ALIGN_RIGHT) {
      bVar4 = std::__copy_move<false,false,std::random_access_iterator_tag>::
              __copy_m<wchar_t_const*,std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>>
                        (f->s,f->s + uVar1,*(vector<wchar_t,_std::allocator<wchar_t>_> **)this);
      *(vector<wchar_t,_std::allocator<wchar_t>_> **)this = bVar4.container;
      while (uVar7 != 0) {
        iVar2._M_current =
             ((bVar4.container)->super__Vector_base<wchar_t,_std::allocator<wchar_t>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            ((bVar4.container)->super__Vector_base<wchar_t,_std::allocator<wchar_t>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<wchar_t,std::allocator<wchar_t>>::_M_realloc_insert<wchar_t_const&>
                    ((vector<wchar_t,std::allocator<wchar_t>> *)bVar4.container,iVar2,&local_48);
        }
        else {
          *iVar2._M_current = local_48;
          ((bVar4.container)->super__Vector_base<wchar_t,_std::allocator<wchar_t>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        uVar8 = uVar8 + 1;
        uVar7 = uVar8;
      }
      goto LAB_0018e7ae;
    }
    bVar4.container = *(vector<wchar_t,_std::allocator<wchar_t>_> **)this;
    if (uVar7 != 0) {
      lVar5 = uVar1 - uVar6;
      do {
        iVar2._M_current = *(wchar_t **)((long)bVar4.container + 8);
        if (iVar2._M_current == *(wchar_t **)((long)bVar4.container + 0x10)) {
          std::vector<wchar_t,std::allocator<wchar_t>>::_M_realloc_insert<wchar_t_const&>
                    ((vector<wchar_t,std::allocator<wchar_t>> *)bVar4.container,iVar2,&local_48);
        }
        else {
          *iVar2._M_current = local_48;
          *(wchar_t **)((long)bVar4.container + 8) = iVar2._M_current + 1;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0);
    }
    *(vector<wchar_t,_std::allocator<wchar_t>_> **)this = bVar4.container;
    __first = f->s;
    __last = __first + f->size_;
  }
  else {
    __first = f->s;
    __last = __first + uVar1;
    bVar4.container = *(vector<wchar_t,_std::allocator<wchar_t>_> **)this;
  }
  bVar4 = std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<wchar_t_const*,std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>>
                    (__first,__last,bVar4);
LAB_0018e7ae:
  *(vector<wchar_t,_std::allocator<wchar_t>_> **)this = bVar4.container;
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }